

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O2

string * __thiscall
flatbuffers::dart::DartGenerator::GenStructObjectAPI_abi_cxx11_
          (string *__return_storage_ptr__,DartGenerator *this,StructDef *struct_def,
          vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
          *non_deprecated_fields)

{
  bool bVar1;
  FieldDef *pFVar2;
  Namespace *current_namespace;
  EnumDef *this_00;
  size_type sVar3;
  DartGenerator *pDVar4;
  FieldDef *pFVar5;
  EnumVal *v;
  pointer ppVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  string field_name;
  string defaultValue;
  string type_name;
  string constructor_args;
  string object_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  IdlNamer *local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  DartGenerator *local_150;
  FieldDef *local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  StructDef *local_e0;
  pointer local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  GenDocComment(&(struct_def->super_Definition).doc_comment,"",__return_storage_ptr__);
  local_198 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[0x11])(&local_90,local_198,struct_def);
  std::operator+(&local_140,"class ",&local_90);
  std::operator+(&local_190,&local_140," implements ");
  std::operator+(&local_1b8,&local_190,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _kFb_abi_cxx11_);
  std::operator+(&local_120,&local_1b8,".Packable {\n");
  local_150 = this;
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_140);
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  local_120._M_string_length = 0;
  local_120.field_2._M_local_buf[0] = '\0';
  ppVar6 = (non_deprecated_fields->
           super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_e0 = struct_def;
  while (pDVar4 = local_150,
        ppVar6 != (non_deprecated_fields->
                  super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
    pFVar2 = ppVar6->second;
    local_d8 = ppVar6;
    (*(local_198->super_Namer)._vptr_Namer[0x12])(&local_1b8,local_198,pFVar2);
    pDVar4 = local_150;
    local_148 = pFVar2;
    getDefaultValue_abi_cxx11_(&local_190,local_150,&pFVar2->value);
    sVar3 = local_190._M_string_length;
    current_namespace = (struct_def->super_Definition).defined_namespace;
    bVar1 = struct_def->fixed;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"T",(allocator<char> *)&local_170);
    pFVar5 = local_148;
    GenDartTypeName(&local_140,pDVar4,&(pFVar2->value).type,current_namespace,local_148,
                    (bool)((bVar1 ^ 1U) & sVar3 == 0),&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    GenDocComment(&(pFVar5->super_Definition).doc_comment,"  ",__return_storage_ptr__);
    struct_def = local_e0;
    std::operator+(&local_d0,"  ",&local_140);
    std::operator+(&local_b0,&local_d0," ");
    std::operator+(&local_100,&local_b0,&local_1b8);
    std::operator+(&local_170,&local_100,";\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    if (local_120._M_string_length != 0) {
      std::__cxx11::string::append((char *)&local_120);
    }
    std::__cxx11::string::append((char *)&local_120);
    std::__cxx11::string::append((char *)&local_120);
    std::operator+(&local_170,"this.",&local_1b8);
    std::__cxx11::string::append((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_170);
    if ((struct_def->fixed == false) && (local_190._M_string_length != 0)) {
      this_00 = (local_148->value).type.enum_def;
      if ((this_00 == (EnumDef *)0x0) || (9 < (local_148->value).type.base_type - BASE_TYPE_UTYPE))
      {
        __return_storage_ptr___00 = &local_170;
        std::operator+(__return_storage_ptr___00," = ",&local_190);
        std::__cxx11::string::append((string *)&local_120);
      }
      else {
        v = EnumDef::FindByValue(this_00,&local_190);
        if (v == (EnumVal *)0x0) {
          (*(local_198->super_Namer)._vptr_Namer[0xf])(&local_70,local_198,this_00);
          std::operator+(&local_d0," = const ",&local_70);
          std::operator+(&local_b0,&local_d0,"._(");
          std::operator+(&local_100,&local_b0,&local_190);
          std::operator+(&local_170,&local_100,")");
          std::__cxx11::string::append((string *)&local_120);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&local_100);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_d0);
          __return_storage_ptr___00 = &local_70;
        }
        else {
          IdlNamer::EnumVariant_abi_cxx11_(&local_100,local_198,this_00,v);
          std::operator+(&local_170," = ",&local_100);
          std::__cxx11::string::append((string *)&local_120);
          std::__cxx11::string::~string((string *)&local_170);
          __return_storage_ptr___00 = &local_100;
        }
      }
      std::__cxx11::string::~string((string *)__return_storage_ptr___00);
    }
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_1b8);
    ppVar6 = local_d8 + 1;
  }
  if (local_120._M_string_length != 0) {
    std::operator+(&local_170,"\n  ",&local_90);
    std::operator+(&local_140,&local_170,"({\n");
    std::operator+(&local_190,&local_140,&local_120);
    std::operator+(&local_1b8,&local_190,"});\n\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_170);
  }
  GenStructObjectAPIPack_abi_cxx11_(&local_1b8,pDVar4,struct_def,non_deprecated_fields);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  GenToString(&local_1b8,pDVar4,&local_90,non_deprecated_fields);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_90);
  return __return_storage_ptr__;
}

Assistant:

std::string GenStructObjectAPI(
      const StructDef &struct_def,
      const std::vector<std::pair<int, FieldDef *>> &non_deprecated_fields) {
    std::string code;
    GenDocComment(struct_def.doc_comment, "", code);

    std::string object_type = namer_.ObjectType(struct_def);
    code += "class " + object_type + " implements " + _kFb + ".Packable {\n";

    std::string constructor_args;
    for (auto it = non_deprecated_fields.begin();
         it != non_deprecated_fields.end(); ++it) {
      const FieldDef &field = *it->second;

      const std::string field_name = namer_.Field(field);
      const std::string defaultValue = getDefaultValue(field.value);
      const std::string type_name =
          GenDartTypeName(field.value.type, struct_def.defined_namespace, field,
                          defaultValue.empty() && !struct_def.fixed, "T");

      GenDocComment(field.doc_comment, "  ", code);
      code += "  " + type_name + " " + field_name + ";\n";

      if (!constructor_args.empty()) constructor_args += ",\n";
      constructor_args += "      ";
      constructor_args += (struct_def.fixed ? "required " : "");
      constructor_args += "this." + field_name;
      if (!struct_def.fixed && !defaultValue.empty()) {
        if (IsEnum(field.value.type)) {
          auto &enum_def = *field.value.type.enum_def;
          if (auto val = enum_def.FindByValue(defaultValue)) {
            constructor_args += " = " + namer_.EnumVariant(enum_def, *val);
          } else {
            constructor_args += " = const " + namer_.Type(enum_def) + "._(" +
                                defaultValue + ")";
          }
        } else {
          constructor_args += " = " + defaultValue;
        }
      }
    }

    if (!constructor_args.empty()) {
      code += "\n  " + object_type + "({\n" + constructor_args + "});\n\n";
    }

    code += GenStructObjectAPIPack(struct_def, non_deprecated_fields);
    code += "\n";
    code += GenToString(object_type, non_deprecated_fields);

    code += "}\n\n";
    return code;
  }